

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O0

void dStackCompress(GlobalLU_t *Glu)

{
  int iVar1;
  int_t *old;
  int_t *piVar2;
  int_t *old_00;
  void *new;
  int_t *new_00;
  int_t *piVar3;
  double *lusup;
  double *ucol;
  int_t *xlusup;
  int_t *usub;
  int_t *xusub;
  int_t *lsub;
  int_t *xlsub;
  double *dto;
  double *dfrom;
  int_t *ito;
  int_t *ifrom;
  char *fragment;
  char *last;
  int ndim;
  int dword;
  int iword;
  GlobalLU_t *Glu_local;
  
  iVar1 = Glu->n;
  piVar3 = Glu->xlsub;
  old = Glu->lsub;
  piVar2 = Glu->xusub;
  old_00 = Glu->usub;
  new = (void *)((long)Glu->lusup + (long)(Glu->xlusup[iVar1] * 8));
  copy_mem_double(piVar2[iVar1],Glu->ucol,new);
  new_00 = (int_t *)((long)new + (long)(piVar2[iVar1] * 4));
  copy_mem_int(piVar3[iVar1],old,new_00);
  piVar3 = (int_t *)((long)new_00 + (long)(piVar3[iVar1] * 4));
  copy_mem_int(piVar2[iVar1],old_00,piVar3);
  iVar1 = ((int)(Glu->stack).array + (Glu->stack).top1) - ((int)piVar3 + piVar2[iVar1] * 4);
  (Glu->stack).used = (Glu->stack).used - iVar1;
  (Glu->stack).top1 = (Glu->stack).top1 - iVar1;
  Glu->ucol = new;
  Glu->lsub = new_00;
  Glu->usub = piVar3;
  return;
}

Assistant:

void
dStackCompress(GlobalLU_t *Glu)
{
    register int iword, dword, ndim;
    char     *last, *fragment;
    int_t    *ifrom, *ito;
    double   *dfrom, *dto;
    int_t    *xlsub, *lsub, *xusub, *usub, *xlusup;
    double   *ucol, *lusup;
    
    iword = sizeof(int);
    dword = sizeof(double);
    ndim = Glu->n;

    xlsub  = Glu->xlsub;
    lsub   = Glu->lsub;
    xusub  = Glu->xusub;
    usub   = Glu->usub;
    xlusup = Glu->xlusup;
    ucol   = Glu->ucol;
    lusup  = Glu->lusup;
    
    dfrom = ucol;
    dto = (double *)((char*)lusup + xlusup[ndim] * dword);
    copy_mem_double(xusub[ndim], dfrom, dto);
    ucol = dto;

    ifrom = lsub;
    ito = (int_t *) ((char*)ucol + xusub[ndim] * iword);
    copy_mem_int(xlsub[ndim], ifrom, ito);
    lsub = ito;
    
    ifrom = usub;
    ito = (int_t *) ((char*)lsub + xlsub[ndim] * iword);
    copy_mem_int(xusub[ndim], ifrom, ito);
    usub = ito;
    
    last = (char*)usub + xusub[ndim] * iword;
    fragment = (char*) (((char*)Glu->stack.array + Glu->stack.top1) - last);
    Glu->stack.used -= (long int) fragment;
    Glu->stack.top1 -= (long int) fragment;

    Glu->ucol = ucol;
    Glu->lsub = lsub;
    Glu->usub = usub;
    
#if ( DEBUGlevel>=1 )
    printf("dStackCompress: fragment %lld\n", (long long) fragment);
    /* for (last = 0; last < ndim; ++last)
	print_lu_col("After compress:", last, 0);*/
#endif    
    
}